

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.hpp
# Opt level: O0

void __thiscall
yactfr::internal::PktProcBuilder::
_buildReadVarInstr<yactfr::internal::BeginReadVarSIntSelInstr,yactfr::VariantWithSignedIntegerSelectorType>
          (PktProcBuilder *this,StructureMemberType *memberType,
          VariantWithSignedIntegerSelectorType *varType,Proc *baseProc,Kind endInstrKind)

{
  Size SVar1;
  BeginReadVarInstr<yactfr::VariantWithSignedIntegerSelectorType,_(yactfr::internal::Instr::Kind)14>
  *this_00;
  Opts *this_01;
  reference this_02;
  Proc *baseProc_00;
  Option *this_03;
  DataType *dt;
  shared_ptr<yactfr::internal::Instr> local_90;
  shared_ptr<yactfr::internal::Instr> local_80;
  undefined1 local_70 [8];
  shared_ptr<yactfr::internal::EndReadDataInstr> endInstr;
  Proc *optProc;
  undefined1 local_40 [4];
  uint i;
  shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr> instr;
  Kind endInstrKind_local;
  Proc *baseProc_local;
  VariantWithSignedIntegerSelectorType *varType_local;
  StructureMemberType *memberType_local;
  PktProcBuilder *this_local;
  
  instr.super___shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = endInstrKind;
  varType_local = (VariantWithSignedIntegerSelectorType *)memberType;
  memberType_local = (StructureMemberType *)this;
  std::
  make_shared<yactfr::internal::BeginReadVarSIntSelInstr,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
            ((StructureMemberType **)local_40,(VariantWithSignedIntegerSelectorType *)&varType_local
            );
  optProc._4_4_ = 0;
  while( true ) {
    SVar1 = VariantWithIntegerSelectorType<long_long>::size
                      (&varType->super_VariantWithIntegerSelectorType<long_long>);
    if (SVar1 <= optProc._4_4_) break;
    this_00 = &std::
               __shared_ptr_access<yactfr::internal::BeginReadVarSIntSelInstr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<yactfr::internal::BeginReadVarSIntSelInstr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40)->
               super_BeginReadVarInstr<yactfr::VariantWithSignedIntegerSelectorType,_(yactfr::internal::Instr::Kind)14>
    ;
    this_01 = BeginReadVarInstr<yactfr::VariantWithSignedIntegerSelectorType,_(yactfr::internal::Instr::Kind)14>
              ::opts(this_00);
    this_02 = std::
              vector<yactfr::internal::ReadVarInstrOpt<yactfr::VariantTypeOption<long_long>_>,_std::allocator<yactfr::internal::ReadVarInstrOpt<yactfr::VariantTypeOption<long_long>_>_>_>
              ::operator[](this_01,(ulong)optProc._4_4_);
    baseProc_00 = ReadVarInstrOpt<yactfr::VariantTypeOption<long_long>_>::proc(this_02);
    this_03 = VariantWithIntegerSelectorType<long_long>::operator[]
                        (&varType->super_VariantWithIntegerSelectorType<long_long>,
                         (ulong)optProc._4_4_);
    dt = VariantTypeOption<long_long>::dataType(this_03);
    _buildReadInstr(this,(StructureMemberType *)0x0,dt,baseProc_00);
    std::
    make_shared<yactfr::internal::EndReadDataInstr,yactfr::internal::Instr::Kind_const&,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
              ((Kind *)local_70,
               (StructureMemberType **)
               ((long)&instr.
                       super___shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 4),
               (VariantWithSignedIntegerSelectorType *)&varType_local);
    std::shared_ptr<yactfr::internal::Instr>::shared_ptr<yactfr::internal::EndReadDataInstr,void>
              (&local_80,(shared_ptr<yactfr::internal::EndReadDataInstr> *)local_70);
    Proc::pushBack(baseProc_00,&local_80);
    std::shared_ptr<yactfr::internal::Instr>::~shared_ptr(&local_80);
    std::shared_ptr<yactfr::internal::EndReadDataInstr>::~shared_ptr
              ((shared_ptr<yactfr::internal::EndReadDataInstr> *)local_70);
    optProc._4_4_ = optProc._4_4_ + 1;
  }
  std::shared_ptr<yactfr::internal::Instr>::
  shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr,void>
            (&local_90,(shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr> *)local_40);
  Proc::pushBack(baseProc,&local_90);
  std::shared_ptr<yactfr::internal::Instr>::~shared_ptr(&local_90);
  std::shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr>::~shared_ptr
            ((shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr> *)local_40);
  return;
}

Assistant:

void PktProcBuilder::_buildReadVarInstr(const StructureMemberType * const memberType,
                                        const VarTypeT& varType, Proc& baseProc,
                                        const Instr::Kind endInstrKind)
{
    auto instr = std::make_shared<BeginReadVarInstrT>(memberType, varType);

    for (auto i = 0U; i < varType.size(); ++i) {
        auto& optProc = instr->opts()[i].proc();

        this->_buildReadInstr(nullptr, varType[i].dataType(), optProc);

        /*
         * The VM can push the procedure of each option as the current
         * one, so each one ends with an "end read variant" instruction
         * to be consistent with other begin/end instruction pairs.
         */
        auto endInstr = std::make_shared<EndReadDataInstr>(endInstrKind, memberType, varType);

        optProc.pushBack(std::move(endInstr));
    }

    baseProc.pushBack(std::move(instr));
}